

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O1

void hputc(char *hstring,char *keyword,char *value)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  int iVar9;
  char *pcVar10;
  long lVar11;
  char newcom [50];
  char line [100];
  undefined8 local_e0;
  char local_d8 [64];
  char local_98 [80];
  undefined1 local_48;
  
  sVar3 = strlen(keyword);
  sVar4 = strlen(value);
  iVar9 = (int)sVar4;
  if (((int)sVar3 == 7) &&
     ((iVar1 = strncmp(keyword,"COMMENT",7), iVar1 == 0 ||
      (iVar1 = strncmp(keyword,"HISTORY",7), iVar1 == 0)))) {
    pcVar5 = ksearch(hstring,"END");
    strncpy(pcVar5 + 0x50,pcVar5,0x50);
    strncpy(pcVar5,keyword,7);
    builtin_strncpy(pcVar5 + 7,
                    "                                                                         ",0x49
                   );
    strncpy(pcVar5 + 9,value,(long)iVar9);
    return;
  }
  local_e0 = sVar3;
  pcVar5 = ksearch(hstring,keyword);
  if (pcVar5 == (char *)0x0) {
    uVar8 = 0;
    do {
      if (hstring[uVar8] == '\0') goto LAB_00190278;
      uVar8 = uVar8 + 1;
    } while (uVar8 != 0xe100);
    uVar8 = 0xe100;
LAB_00190278:
    if ((int)uVar8 != 0) {
      pcVar5 = hstring;
      do {
        pcVar6 = strnsrch(pcVar5,"END",(int)(hstring + (uVar8 & 0xffffffff)) - (int)pcVar5);
        if (pcVar6 == (char *)0x0) break;
        lVar11 = ((long)pcVar6 - (long)hstring) % 0x50;
        if ((lVar11 < 8) && (0x5d < (byte)(pcVar6[3] - 0x21U) || pcVar6[3] == '=')) {
          pcVar7 = pcVar6 + -lVar11;
          if (0 < lVar11) {
            pcVar10 = pcVar7;
            do {
              if (*pcVar10 != ' ') {
                pcVar5 = pcVar6 + 1;
              }
              pcVar10 = pcVar10 + 1;
            } while (pcVar10 < pcVar6);
          }
          if (pcVar5 <= pcVar6) goto LAB_00190337;
        }
        else {
          pcVar5 = pcVar6 + 1;
        }
      } while (pcVar5 < hstring + (uVar8 & 0xffffffff));
    }
    pcVar7 = (char *)0x0;
LAB_00190337:
    if (pcVar7 == hstring || pcVar7 == (char *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar6 = pcVar7 + 0x50;
      do {
        iVar1 = strncmp(pcVar6 + -0xa0,"        ",8);
        pcVar6 = pcVar6 + -0x50;
      } while (iVar1 == 0);
      pcVar5 = (char *)0x0;
      if (pcVar6 < pcVar7) {
        pcVar5 = pcVar6;
      }
    }
    if (pcVar5 == (char *)0x0) {
      pcVar5 = ksearch(hstring,"END");
      pcVar6 = pcVar5 + 0x50;
      strncpy(pcVar6,pcVar5,0x50);
    }
    else {
      pcVar6 = pcVar5 + 0x50;
    }
  }
  else {
    pcVar7 = local_98;
    strncpy(pcVar7,pcVar5,0x50);
    local_48 = 0;
    pcVar6 = strchr(pcVar7,0x27);
    if (pcVar6 != (char *)0x0) {
      pcVar7 = strchr(pcVar6 + 1,0x27);
    }
    pcVar6 = pcVar5 + 0x50;
    pcVar7 = strchr(pcVar7,0x2f);
    if (pcVar7 != (char *)0x0) {
      sVar3 = (size_t)(((int)local_98 - (int)pcVar7) + 0x50);
      strncpy(local_d8,pcVar7 + 1,sVar3);
      for (pcVar7 = local_d8 + (sVar3 - 1); (local_d8 < pcVar7 && (pcVar7[-1] == ' '));
          pcVar7 = pcVar7 + -1) {
        pcVar7[-1] = '\0';
      }
      sVar3 = strlen(local_d8);
      iVar1 = (int)sVar3;
      goto LAB_001903bf;
    }
  }
  local_d8[0] = '\0';
  iVar1 = 0;
LAB_001903bf:
  if (pcVar5 < pcVar6) {
    memset(pcVar5,0x20,(long)pcVar6 - (long)pcVar5);
  }
  strncpy(pcVar5,keyword,(long)(int)local_e0);
  pcVar5[8] = '=';
  pcVar5[9] = ' ';
  sVar3 = (size_t)iVar9;
  if (*value == '\'') {
    strncpy(pcVar5 + 10,value,sVar3);
    uVar2 = 0x1e;
    if (0x13 < iVar9) {
      uVar2 = iVar9 + 0xc;
    }
  }
  else {
    strncpy(pcVar5 + (0x1e - sVar3),value,sVar3);
    uVar2 = 0x1e;
  }
  if (0 < iVar1) {
    iVar9 = 0x4e - uVar2;
    if ((int)(uVar2 + iVar1 + 2) < 0x51) {
      iVar9 = iVar1;
    }
    uVar8 = (ulong)uVar2;
    pcVar5[uVar8 + 2] = '/';
    sVar3 = (size_t)iVar9;
    strncpy(pcVar5 + uVar8 + 3,local_d8,sVar3);
    if (pcVar5 + sVar3 + uVar8 + 3 < pcVar6) {
      memset(pcVar5 + sVar3 + uVar8 + 3,0x20,
             (size_t)(pcVar6 + (-3 - (long)(pcVar5 + uVar8 + sVar3))));
    }
  }
  return;
}

Assistant:

static void
hputc (hstring,keyword,value)

char *hstring;
char *keyword;
char *value;	/* character string containing the value for variable
		   keyword.  trailing and leading blanks are removed.  */
{
    char squot = 39;
    char line[100];
    char newcom[50];
    char blank[80];
    char *v, *vp, *v1, *v2, *q1, *q2, *c1, *ve;
    int lkeyword, lcom, lval, lc, i;

    for (i = 0; i < 80; i++)
	blank[i] = ' ';

    /*  find length of keyword and value */
    lkeyword = strlen (keyword);
    lval = strlen (value);

    /*  If COMMENT or HISTORY, always add it just before the END */
    if (lkeyword == 7 && (strncmp (keyword,"COMMENT",7) == 0 ||
	strncmp (keyword,"HISTORY",7) == 0)) {

	/* Find end of header */
	v1 = ksearch (hstring,"END");
	v2 = v1 + 80;

	/* Move END down one line */
	strncpy (v2, v1, 80);

	/* Insert keyword */
	strncpy (v1,keyword,7);

	/* Pad with spaces */
	for (vp = v1+lkeyword; vp < v2; vp++)
	    *vp = ' ';

	/* Insert comment */
	strncpy (v1+9,value,lval);
	return;
	}

    /* Otherwise search for keyword */
    else
	v1 = ksearch (hstring,keyword);

    /*  If parameter is not found, find a place to put it */
    if (v1 == NULL) {
	
	/* First look for blank lines before END */
        v1 = blsearch (hstring, "END");
    
	/*  Otherwise, create a space for it at the end of the header */
	if (v1 == NULL) {
	    ve = ksearch (hstring,"END");
	    v1 = ve;
	    v2 = v1 + 80;
	    strncpy (v2, ve, 80);
	    }
	else
	    v2 = v1 + 80;
	lcom = 0;
	newcom[0] = 0;
	}

    /*  Otherwise, extract the entry for this keyword from the header */
    else {
	strncpy (line, v1, 80);
	line[80] = 0;
	v2 = v1 + 80;

	/*  check for quoted value */
	q1 = strchr (line, squot);
	if (q1 != NULL)
	    q2 = strchr (q1+1,squot);
	else
	    q2 = line;

	/*  extract comment and remove trailing spaces */

	c1 = strchr (q2,'/');
	if (c1 != NULL) {
	    lcom = 80 - (c1 - line);
	    strncpy (newcom, c1+1, lcom);
	    vp = newcom + lcom - 1;
	    while (vp-- > newcom && *vp == ' ')
		*vp = 0;
	    lcom = strlen (newcom);
	    }
	else {
	    newcom[0] = 0;
	    lcom = 0;
	    }
	}

    /* Fill new entry with spaces */
    for (vp = v1; vp < v2; vp++)
	*vp = ' ';

    /*  Copy keyword to new entry */
    strncpy (v1, keyword, lkeyword);

    /*  Add parameter value in the appropriate place */
    vp = v1 + 8;
    *vp = '=';
    vp = v1 + 9;
    *vp = ' ';
    vp = vp + 1;
    if (*value == squot) {
	strncpy (vp, value, lval);
	if (lval+12 > 31)
	    lc = lval + 12;
	else
	    lc = 30;
	}
    else {
	vp = v1 + 30 - lval;
	strncpy (vp, value, lval);
	lc = 30;
	}

    /* Add comment in the appropriate place */
	if (lcom > 0) {
	    if (lc+2+lcom > 80)
		lcom = 78 - lc;
	    vp = v1 + lc + 2;     /* Jul 16 1997: was vp = v1 + lc * 2 */
	    *vp = '/';
	    vp = vp + 1;
	    strncpy (vp, newcom, lcom);
	    for (v = vp + lcom; v < v2; v++)
		*v = ' ';
	    }

	return;
}